

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Fts5HashClear(Fts5Hash *pHash)

{
  Fts5HashEntry *pFVar1;
  Fts5HashEntry *p;
  int iVar2;
  long lVar3;
  
  iVar2 = pHash->nSlot;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      p = pHash->aSlot[lVar3];
      while (p != (Fts5HashEntry *)0x0) {
        pFVar1 = p->pHashNext;
        sqlite3_free(p);
        p = pFVar1;
      }
      lVar3 = lVar3 + 1;
      iVar2 = pHash->nSlot;
    } while (lVar3 < iVar2);
  }
  memset(pHash->aSlot,0,(long)iVar2 << 3);
  pHash->nEntry = 0;
  return;
}

Assistant:

static void sqlite3Fts5HashClear(Fts5Hash *pHash){
  int i;
  for(i=0; i<pHash->nSlot; i++){
    Fts5HashEntry *pNext;
    Fts5HashEntry *pSlot;
    for(pSlot=pHash->aSlot[i]; pSlot; pSlot=pNext){
      pNext = pSlot->pHashNext;
      sqlite3_free(pSlot);
    }
  }
  memset(pHash->aSlot, 0, pHash->nSlot * sizeof(Fts5HashEntry*));
  pHash->nEntry = 0;
}